

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

uint GetFunctionRating(ExpressionContext *ctx,FunctionData *function,TypeFunction *instance,
                      ArrayView<CallArgumentData> arguments)

{
  uint uVar1;
  ScopeData *type;
  ScopeData *type_00;
  ExprBase *value;
  ScopeData *pSVar2;
  uint uVar3;
  ScopeData *pSVar4;
  ulong uVar5;
  TypeArray *rArray;
  int iVar6;
  ScopeData *pSVar7;
  TypeHandle *pTVar8;
  bool bVar9;
  FunctionValue local_48;
  
  if ((function->arguments).count == arguments.count) {
    pTVar8 = (instance->arguments).head;
    if (pTVar8 == (TypeHandle *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar5 = 0;
      uVar3 = 0;
      do {
        if ((function->arguments).count <= uVar5) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]"
                       );
        }
        if (uVar5 == arguments.count) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x22a,
                        "T &ArrayView<CallArgumentData>::operator[](unsigned int) [T = CallArgumentData]"
                       );
        }
        type = (ScopeData *)pTVar8->type;
        type_00 = (ScopeData *)arguments.data[uVar5].type;
        if (type != type_00) {
          if (type_00 == (ScopeData *)ctx->typeNullPtr) {
            if (((type != (ScopeData *)0x0) &&
                (uVar1 = *(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase, uVar1 < 0x16)) &&
               ((0x340000U >> (uVar1 & 0x1f) & 1) != 0)) goto LAB_00170179;
            if ((type != (ScopeData *)ctx->typeAutoRef) && (type != (ScopeData *)ctx->typeAutoArray)
               ) goto LAB_0016ff25;
LAB_00170176:
            uVar3 = uVar3 + 5;
          }
          else {
LAB_0016ff25:
            if (*(bool *)&((TypeBase *)((long)&type->startOffset + 4))->_vptr_TypeBase != false)
            goto LAB_00170179;
            uVar1 = *(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase;
            if ((function->arguments).data[uVar5].isExplicit == true) {
              if (uVar1 == 0x15) {
LAB_0016ff55:
                if ((((type_00 != (ScopeData *)0x0) &&
                     (value = arguments.data[uVar5].value, value != (ExprBase *)0x0)) &&
                    ((uVar1 = *(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase,
                     uVar1 == 0x1a || (uVar1 == 0x15)))) &&
                   (GetFunctionForType(&local_48,ctx,value->source,value,(TypeFunction *)type),
                   local_48.function != (FunctionData *)0x0)) goto LAB_00170179;
              }
              goto LAB_00170190;
            }
            if (uVar1 == 0x14) {
              if (type_00 != (ScopeData *)0x0) {
                if ((*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase == 0x13) &&
                   (*(ScopeData **)&((TypeStruct *)((long)&type->functions + 0x18))->super_TypeBase
                    == *(ScopeData **)((long)&type_00->types + 0x18))) {
                  uVar3 = uVar3 + 2;
                  goto LAB_00170179;
                }
                goto LAB_00170002;
              }
              bVar9 = true;
LAB_00170129:
              if (type != (ScopeData *)ctx->typeAutoRef) {
                bVar9 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type);
                if ((bVar9) &&
                   (bVar9 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type_00), bVar9)) {
                  uVar3 = uVar3 + 1;
                  goto LAB_00170179;
                }
                goto LAB_00170190;
              }
              if ((!bVar9) && (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase == 0x12))
              goto LAB_00170176;
            }
            else {
LAB_00170002:
              if (((type_00 != (ScopeData *)0x0) && (type == (ScopeData *)ctx->typeAutoArray)) &&
                 (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase - 0x13 < 2))
              goto LAB_00170176;
              if (uVar1 != 0x12) {
LAB_001700e1:
                bVar9 = type_00 == (ScopeData *)0x0;
                if ((bVar9) || (uVar1 != 0x18)) {
LAB_00170115:
                  if (uVar1 == 0x15) goto LAB_0016ff55;
                }
                else if (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase == 0x18) {
                  iVar6 = -1;
                  pSVar4 = type_00;
                  do {
                    if (pSVar4 == type) {
                      if (iVar6 != 0) goto LAB_00170176;
                      break;
                    }
                    pSVar4 = *(ScopeData **)
                              &(((TypeStruct *)((long)&pSVar4->scopes + 0x18))->super_TypeBase).
                               typeID;
                    iVar6 = iVar6 + -1;
                  } while (pSVar4 != (ScopeData *)0x0);
                  goto LAB_00170115;
                }
                if (uVar1 != 0x12) goto LAB_00170129;
LAB_00170123:
                bVar9 = type_00 == (ScopeData *)0x0;
                if (*(ScopeData **)((long)&type->types + 0x18) == type_00) goto LAB_00170176;
                goto LAB_00170129;
              }
              if (type_00 == (ScopeData *)0x0) goto LAB_00170123;
              if ((((*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x12) ||
                   (pSVar4 = *(ScopeData **)((long)&type->types + 0x18), pSVar4 == (ScopeData *)0x0)
                   ) || ((pSVar4->uniqueId != 0x14 ||
                         ((pSVar2 = *(ScopeData **)((long)&type_00->types + 0x18),
                          pSVar2 == (ScopeData *)0x0 || (pSVar2->uniqueId != 0x13)))))) ||
                 (*(FunctionData **)((long)&pSVar4->functions + 0x18) !=
                  (FunctionData *)((TypeBase *)((long)&pSVar2->types + 0x18))->_vptr_TypeBase)) {
                if ((((*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase == 0x12) &&
                     (pSVar4 = *(ScopeData **)((long)&type->types + 0x18),
                     pSVar4 != (ScopeData *)0x0)) && (pSVar4->uniqueId == 0x18)) &&
                   ((pSVar2 = *(ScopeData **)((long)&type_00->types + 0x18),
                    pSVar2 != (ScopeData *)0x0 && (pSVar2->uniqueId == 0x18)))) {
                  iVar6 = -1;
                  pSVar7 = pSVar2;
                  do {
                    if (pSVar7 == pSVar4) {
                      if (iVar6 != 0) goto LAB_00170176;
                      break;
                    }
                    pSVar7 = *(ScopeData **)((long)&pSVar7->scopes + 0x20);
                    iVar6 = iVar6 + -1;
                  } while (pSVar7 != (ScopeData *)0x0);
                  iVar6 = -1;
                  do {
                    if (pSVar4 == pSVar2) {
                      if (iVar6 != 0) goto LAB_0017018b;
                      break;
                    }
                    pSVar4 = *(ScopeData **)((long)&pSVar4->scopes + 0x20);
                    iVar6 = iVar6 + -1;
                  } while (pSVar4 != (ScopeData *)0x0);
                  goto LAB_001700e1;
                }
                goto LAB_00170123;
              }
            }
LAB_0017018b:
            uVar3 = uVar3 + 10;
          }
        }
LAB_00170179:
        uVar5 = uVar5 + 1;
        pTVar8 = pTVar8->next;
      } while (pTVar8 != (TypeHandle *)0x0);
    }
  }
  else {
LAB_00170190:
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

unsigned GetFunctionRating(ExpressionContext &ctx, FunctionData *function, TypeFunction *instance, ArrayView<CallArgumentData> arguments)
{
	if(function->arguments.size() != arguments.size())
		return ~0u;	// Definitely, this isn't the function we are trying to call. Argument count does not match.

	unsigned rating = 0;

	unsigned i = 0;

	for(TypeHandle *argType = instance->arguments.head; argType; argType = argType->next, i++)
	{
		ArgumentData &expectedArgument = function->arguments[i];
		TypeBase *expectedType = argType->type;

		CallArgumentData &actualArgument = arguments[i];
		TypeBase *actualType = actualArgument.type;

		if(expectedType != actualType)
		{
			if(actualType == ctx.typeNullPtr)
			{
				// nullptr is convertable to T ref, T[] and function pointers
				if(isType<TypeRef>(expectedType) || isType<TypeUnsizedArray>(expectedType) || isType<TypeFunction>(expectedType))
					continue;

				// nullptr is also convertable to auto ref and auto[], but it has the same rating as type ref -> auto ref and array -> auto[] defined below
				if(expectedType == ctx.typeAutoRef || expectedType == ctx.typeAutoArray)
				{
					rating += 5;
					continue;
				}
			}

			// Generic function argument
			if(expectedType->isGeneric)
				continue;

			if(expectedArgument.isExplicit)
			{
				if(TypeFunction *target = getType<TypeFunction>(expectedType))
				{
					if(actualArgument.value && (isType<TypeFunction>(actualArgument.type) || isType<TypeFunctionSet>(actualArgument.type)))
					{
						if(FunctionValue functionValue = GetFunctionForType(ctx, actualArgument.value->source, actualArgument.value, target))
							continue;
					}
				}

				return ~0u;
			}

			// array -> class (unsized array)
			if(isType<TypeUnsizedArray>(expectedType) && isType<TypeArray>(actualType))
			{
				TypeUnsizedArray *lArray = getType<TypeUnsizedArray>(expectedType);
				TypeArray *rArray = getType<TypeArray>(actualType);

				if(lArray->subType == rArray->subType)
				{
					rating += 2;
					continue;
				}
			}

			// array -> auto[]
			if(expectedType == ctx.typeAutoArray && (isType<TypeArray>(actualType) || isType<TypeUnsizedArray>(actualType)))
			{
				rating += 5;
				continue;
			}

			// array[N] ref -> array[] -> array[] ref
			if(isType<TypeRef>(expectedType) && isType<TypeRef>(actualType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);
				TypeRef *rRef = getType<TypeRef>(actualType);

				if(isType<TypeUnsizedArray>(lRef->subType) && isType<TypeArray>(rRef->subType))
				{
					TypeUnsizedArray *lArray = getType<TypeUnsizedArray>(lRef->subType);
					TypeArray *rArray = getType<TypeArray>(rRef->subType);

					if(lArray->subType == rArray->subType)
					{
						rating += 10;
						continue;
					}
				}
			}

			// derived ref -> base ref
			// base ref -> derived ref
			if(isType<TypeRef>(expectedType) && isType<TypeRef>(actualType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);
				TypeRef *rRef = getType<TypeRef>(actualType);

				if(isType<TypeClass>(lRef->subType) && isType<TypeClass>(rRef->subType))
				{
					TypeClass *lClass = getType<TypeClass>(lRef->subType);
					TypeClass *rClass = getType<TypeClass>(rRef->subType);

					if(IsDerivedFrom(rClass, lClass))
					{
						rating += 5;
						continue;
					}

					if(IsDerivedFrom(lClass, rClass))
					{
						rating += 10;
						continue;
					}
				}
			}

			if(isType<TypeClass>(expectedType) && isType<TypeClass>(actualType))
			{
				TypeClass *lClass = getType<TypeClass>(expectedType);
				TypeClass *rClass = getType<TypeClass>(actualType);

				if(IsDerivedFrom(rClass, lClass))
				{
					rating += 5;
					continue;
				}
			}

			if(isType<TypeFunction>(expectedType))
			{
				TypeFunction *lFunction = getType<TypeFunction>(expectedType);

				if(actualArgument.value && (isType<TypeFunction>(actualArgument.type) || isType<TypeFunctionSet>(actualArgument.type)))
				{
					if(FunctionValue functionValue = GetFunctionForType(ctx, actualArgument.value->source, actualArgument.value, lFunction))
						continue;
				}
				
				return ~0u;
			}

			// type -> type ref
			if(isType<TypeRef>(expectedType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);

				if(lRef->subType == actualType)
				{
					rating += 5;
					continue;
				}
			}

			// type ref -> auto ref
			if(expectedType == ctx.typeAutoRef && isType<TypeRef>(actualType))
			{
				rating += 5;
				continue;
			}

			// type -> type ref -> auto ref
			if(expectedType == ctx.typeAutoRef)
			{
				rating += 10;
				continue;
			}

			// numeric -> numeric
			if(ctx.IsNumericType(expectedType) && ctx.IsNumericType(actualType))
			{
				rating += 1;
				continue;
			}

			return ~0u;
		}
	}

	return rating;
}